

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalTopN::Combine
          (PhysicalTopN *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  pthread_mutex_t *__mutex;
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  TopNHeap::Finalize((TopNHeap *)(pLVar2 + 1));
  __mutex = (pthread_mutex_t *)(pGVar1 + 1);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  TopNHeap::Combine((TopNHeap *)
                    &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data
                     .__list,(TopNHeap *)(pLVar2 + 1));
  pthread_mutex_unlock(__mutex);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalTopN::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<TopNGlobalSinkState>();
	auto &lstate = input.local_state.Cast<TopNLocalSinkState>();

	// scan the local top N and append it to the global heap
	lstate.heap.Finalize();
	lock_guard<mutex> guard(gstate.lock);
	gstate.heap.Combine(lstate.heap);

	return SinkCombineResultType::FINISHED;
}